

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O2

string * __thiscall
BtorSimVCDWriter::get_am_identifier
          (string *__return_storage_ptr__,BtorSimVCDWriter *this,int64_t id,string *idx)

{
  map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  BtorSimBitVector *bv;
  iterator iVar1;
  mapped_type *pmVar2;
  string *this_01;
  pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> key;
  string local_d0;
  key_type local_b0;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bv = btorsim_bv_char_to_bv((idx->_M_dataplus)._M_p);
  btorsim_bv_to_hex_string_abi_cxx11_(&local_d0,bv);
  local_b0.second._M_dataplus._M_p = (pointer)&local_b0.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
    local_b0.second.field_2._8_8_ = local_d0.field_2._8_8_;
  }
  else {
    local_b0.second._M_dataplus._M_p = local_d0._M_dataplus._M_p;
  }
  local_b0.second._M_string_length = local_d0._M_string_length;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_b0.first = id;
  std::__cxx11::string::~string((string *)&local_d0);
  btorsim_bv_free(bv);
  this_00 = &this->am_identifiers;
  iVar1 = std::
          _Rb_tree<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_b0);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->am_identifiers)._M_t._M_impl.super__Rb_tree_header
     ) {
    if (this->readable_vcd == true) {
      std::__cxx11::to_string(&local_88,id);
      std::operator+(&local_68,"n",&local_88);
      std::operator+(&local_48,&local_68,"@");
      std::operator+(&local_d0,&local_48,&local_b0.second);
      pmVar2 = std::
               map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_b0);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      this_01 = &local_88;
    }
    else {
      generate_next_identifier_abi_cxx11_(&local_d0,this);
      pmVar2 = std::
               map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_b0);
      this_01 = &local_d0;
      std::__cxx11::string::operator=((string *)pmVar2,(string *)this_01);
    }
    std::__cxx11::string::~string((string *)this_01);
  }
  pmVar2 = std::
           map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_b0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_b0.second);
  return __return_storage_ptr__;
}

Assistant:

std::string
BtorSimVCDWriter::get_am_identifier (int64_t id, std::string idx)
{
  BtorSimBitVector* bv_idx = btorsim_bv_char_to_bv (idx.c_str ());
  auto key = std::make_pair (id, btorsim_bv_to_hex_string (bv_idx));
  btorsim_bv_free (bv_idx);
  if (am_identifiers.find (key) == am_identifiers.end ())
  {
    if (readable_vcd)
    {
      am_identifiers[key] = "n" + std::to_string (id) + "@" + key.second;
    }
    else
      am_identifiers[key] = generate_next_identifier ();
  }
  return am_identifiers[key];
}